

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

nng_err nng_init(nng_init_params *params)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  int16_t local_40;
  int16_t local_38;
  int16_t local_30;
  nng_err local_2c;
  undefined1 local_26 [2];
  nng_err rv;
  nng_init_params zero;
  nng_init_params *params_local;
  
  zero._6_8_ = params;
  memset(local_26,0,0xe);
  do {
    _Var1 = nni_atomic_flag_test_and_set(&init_busy);
  } while (_Var1);
  if (init_count == 0) {
    if (zero._6_8_ == 0) {
      zero._6_8_ = local_26;
    }
    if (*(short *)zero._6_8_ == 0) {
      iVar2 = nni_plat_ncpu();
      local_30 = (int16_t)(iVar2 << 1);
    }
    else {
      local_30 = *(int16_t *)zero._6_8_;
    }
    init_params.num_task_threads = local_30;
    if (*(short *)(zero._6_8_ + 2) == 0) {
      init_params.max_task_threads = 0x10;
    }
    else {
      init_params.max_task_threads = *(int16_t *)(zero._6_8_ + 2);
    }
    if (*(short *)(zero._6_8_ + 4) == 0) {
      iVar2 = nni_plat_ncpu();
      local_38 = (int16_t)iVar2;
    }
    else {
      local_38 = *(int16_t *)(zero._6_8_ + 4);
    }
    init_params.num_expire_threads = local_38;
    if (*(short *)(zero._6_8_ + 6) == 0) {
      init_params.max_expire_threads = 8;
    }
    else {
      init_params.max_expire_threads = *(int16_t *)(zero._6_8_ + 6);
    }
    if (*(short *)(zero._6_8_ + 8) == 0) {
      iVar2 = nni_plat_ncpu();
      local_40 = (int16_t)iVar2;
    }
    else {
      local_40 = *(int16_t *)(zero._6_8_ + 8);
    }
    init_params.num_poller_threads = local_40;
    if (*(short *)(zero._6_8_ + 10) == 0) {
      init_params.max_poller_threads = 8;
    }
    else {
      init_params.max_poller_threads = *(int16_t *)(zero._6_8_ + 10);
    }
    if (*(short *)(zero._6_8_ + 0xc) == 0) {
      init_params.num_resolver_threads = 4;
    }
    else {
      init_params.num_resolver_threads = *(int16_t *)(zero._6_8_ + 0xc);
    }
    local_2c = nni_plat_init(&init_params);
    if ((((local_2c == NNG_OK) && (local_2c = nni_taskq_sys_init(&init_params), local_2c == NNG_OK))
        && (local_2c = nni_reap_sys_init(), local_2c == NNG_OK)) &&
       ((local_2c = nni_aio_sys_init(&init_params), local_2c == NNG_OK &&
        (local_2c = nni_tls_sys_init(), local_2c == NNG_OK)))) {
      nni_sp_tran_sys_init();
      pcVar3 = nng_version();
      nng_log_notice("NNG-INIT","NNG library version %s initialized",pcVar3);
      init_count = init_count + 1;
      nni_atomic_flag_reset(&init_busy);
      params_local._4_4_ = local_2c;
    }
    else {
      nni_atomic_flag_reset(&init_busy);
      nng_fini();
      params_local._4_4_ = local_2c;
    }
  }
  else if (zero._6_8_ == 0) {
    init_count = init_count + 1;
    nni_atomic_flag_reset(&init_busy);
    params_local._4_4_ = NNG_OK;
  }
  else {
    nni_atomic_flag_reset(&init_busy);
    params_local._4_4_ = NNG_EBUSY;
  }
  return params_local._4_4_;
}

Assistant:

nng_err
nng_init(nng_init_params *params)
{
	nng_init_params zero = { 0 };
	nng_err         rv;

	// cheap spin lock
	while (nni_atomic_flag_test_and_set(&init_busy)) {
		continue;
	}
	if (init_count > 0) {
		if (params != NULL) {
			nni_atomic_flag_reset(&init_busy);
			return (NNG_EBUSY);
		}
		init_count++;
		nni_atomic_flag_reset(&init_busy);
		return (0);
	}
	if (params == NULL) {
		params = &zero;
	}
	init_params.num_task_threads     = params->num_task_threads
	        ? params->num_task_threads
	        : NNG_NUM_TASKQ_THREADS;
	init_params.max_task_threads     = params->max_task_threads
	        ? params->max_task_threads
	        : NNG_MAX_TASKQ_THREADS;
	init_params.num_expire_threads   = params->num_expire_threads
	      ? params->num_expire_threads
	      : NNG_NUM_EXPIRE_THREADS;
	init_params.max_expire_threads   = params->max_expire_threads
	      ? params->max_expire_threads
	      : NNG_MAX_EXPIRE_THREADS;
	init_params.num_poller_threads   = params->num_poller_threads
	      ? params->num_poller_threads
	      : NNG_NUM_POLLER_THREADS;
	init_params.max_poller_threads   = params->max_poller_threads
	      ? params->max_poller_threads
	      : NNG_MAX_POLLER_THREADS;
	init_params.num_resolver_threads = params->num_resolver_threads
	    ? params->num_resolver_threads
	    : NNG_RESOLV_CONCURRENCY;

	if (((rv = nni_plat_init(&init_params)) != 0) ||
	    ((rv = nni_taskq_sys_init(&init_params)) != 0) ||
	    ((rv = nni_reap_sys_init()) != 0) ||
	    ((rv = nni_aio_sys_init(&init_params)) != 0) ||
	    ((rv = nni_tls_sys_init()) != 0)) {
		nni_atomic_flag_reset(&init_busy);
		nng_fini();
		return (rv);
	}

	// following never fails
	nni_sp_tran_sys_init();

	nng_log_notice(
	    "NNG-INIT", "NNG library version %s initialized", nng_version());
	init_count++;
	nni_atomic_flag_reset(&init_busy);
	return (rv);
}